

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::DoStringSplit
              (Arguments *args,CallInfo *callInfo,JavascriptString *input,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  uint32 uVar5;
  Type TVar6;
  JavascriptArray *pJVar7;
  SparseArraySegmentBase *pSVar8;
  Var pvVar9;
  undefined4 *puVar10;
  JavascriptRegExp *thisObj;
  JavascriptString *match;
  RecyclableObject *this;
  CharCount limit;
  Var local_38;
  
  uVar3 = *(uint *)&args->Info & 0xffffff;
  if (uVar3 != 1) {
    local_38 = (Var)0xffffffff;
    if (2 < uVar3) {
      pvVar9 = Arguments::operator[](args,2);
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar9);
      if (BVar4 == 0) {
        local_38 = Arguments::operator[](args,2);
        if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar2) goto LAB_00d26a67;
          *puVar10 = 0;
        }
        if (((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
          if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar2) goto LAB_00d26a67;
            *puVar10 = 0;
          }
        }
        else {
          uVar5 = JavascriptConversion::ToUInt32_Full(local_38,scriptContext);
          local_38 = (Var)(ulong)uVar5;
        }
      }
    }
    limit = (CharCount)local_38;
    if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols == false) {
      pvVar9 = Arguments::operator[](args,1);
      bVar2 = VarIs<Js::JavascriptRegExp>(pvVar9);
      if (bVar2) {
        pvVar9 = Arguments::operator[](args,1);
        thisObj = UnsafeVarTo<Js::JavascriptRegExp>(pvVar9);
        bVar2 = RegexHelper::IsResultNotUsed((uint)(byte)callInfo->field_0x3);
        pvVar9 = RegexHelper::RegexSplit
                           (scriptContext,(RecyclableObject *)thisObj,input,limit,bVar2,(void *)0x0)
        ;
        return pvVar9;
      }
    }
    pvVar9 = Arguments::operator[](args,1);
    match = JavascriptConversion::ToString(pvVar9,scriptContext);
    if ((callInfo->field_0x3 & 0x10) != 0) {
      return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
    }
    if (limit == 0) {
      pJVar7 = JavascriptLibrary::CreateArray
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
      return pJVar7;
    }
    pvVar9 = Arguments::operator[](args,1);
    if (pvVar9 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d26a67;
      *puVar10 = 0;
    }
    if (((ulong)pvVar9 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar9 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00d26a67;
      *puVar10 = 0;
    }
    if ((ulong)pvVar9 >> 0x32 == 0 && ((ulong)pvVar9 & 0xffff000000000000) != 0x1000000000000) {
      this = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00d26a67;
        *puVar10 = 0;
      }
      TVar6 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar6) {
        BVar4 = RecyclableObject::IsExternal(this);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
LAB_00d26a67:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar10 = 0;
        }
        TVar6 = TypeIds_FirstNumberType;
      }
    }
    else {
      TVar6 = TypeIds_FirstNumberType;
    }
    if (TVar6 != TypeIds_Undefined) {
      pvVar9 = RegexHelper::StringSplit(match,input,limit);
      return pvVar9;
    }
  }
  pJVar7 = JavascriptLibrary::CreateArray
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,1);
  pSVar8 = JavascriptArray::GetLastUsedSegment(pJVar7);
  if ((pSVar8->left == 0) && (pSVar8->size != 0)) {
    JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>(pJVar7,0,input);
  }
  else {
    JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>(pJVar7,0,input);
  }
  return pJVar7;
}

Assistant:

Var JavascriptString::DoStringSplit(Arguments& args, CallInfo& callInfo, JavascriptString* input, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 1)
        {
            JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
            ary->DirectSetItemAt(0, input);
            return ary;
        }
        else
        {
            uint32 limit;
            if (args.Info.Count < 3 || JavascriptOperators::IsUndefinedObject(args[2]))
            {
                limit = UINT_MAX;
            }
            else
            {
                limit = JavascriptConversion::ToUInt32(args[2], scriptContext);
            }

            // When the config is enabled, the operation is handled by RegExp.prototype[@@split].
            if (!scriptContext->GetConfig()->IsES6RegExSymbolsEnabled()
                && VarIs<JavascriptRegExp>(args[1]))
            {
                return RegexHelper::RegexSplit(scriptContext, UnsafeVarTo<JavascriptRegExp>(args[1]), input, limit,
                    RegexHelper::IsResultNotUsed(callInfo.Flags));
            }
            else
            {
                JavascriptString* separator = JavascriptConversion::ToString(args[1], scriptContext);

                if (callInfo.Flags & CallFlags_NotUsed)
                {
                    return scriptContext->GetLibrary()->GetNull();
                }

                if (!limit)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(0);
                    return ary;
                }

                if (JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
                    ary->DirectSetItemAt(0, input);
                    return ary;
                }

                return RegexHelper::StringSplit(separator, input, limit);
            }
        }
    }